

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O0

void init_default_stack_impl(void)

{
  bool bVar1;
  char *value;
  GetStackImplementation *c;
  int i;
  
  init_default_stack_impl_inner();
  value = getenv("TCMALLOC_STACKTRACE_METHOD_VERBOSE");
  bVar1 = tcmalloc::commandlineflags::StringToBool(value,false);
  if (bVar1) {
    fprintf(_stderr,"Chosen stacktrace method is %s\nSupported methods:\n",get_stack_impl->name);
    for (c._4_4_ = 0; c._4_4_ < 4; c._4_4_ = c._4_4_ + 1) {
      fprintf(_stderr,"* %s\n",all_impls[(int)c._4_4_]->name);
    }
    fputs("\nUse TCMALLOC_STACKTRACE_METHOD environment variable to override\n",_stderr);
  }
  return;
}

Assistant:

ATTRIBUTE_NOINLINE
static void init_default_stack_impl(void) {
  init_default_stack_impl_inner();
  if (EnvToBool("TCMALLOC_STACKTRACE_METHOD_VERBOSE", false)) {
    fprintf(stderr, "Chosen stacktrace method is %s\nSupported methods:\n", get_stack_impl->name);
    for (int i = 0; i < sizeof(all_impls) / sizeof(all_impls[0]); i++) {
      GetStackImplementation *c = all_impls[i];
      fprintf(stderr, "* %s\n", c->name);
    }
    fputs("\nUse TCMALLOC_STACKTRACE_METHOD environment variable to override\n", stderr);
  }
}